

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repattrn.cpp
# Opt level: O1

int32_t __thiscall
icu_63::RegexPattern::split
          (RegexPattern *this,UText *input,UText **dest,int32_t destCapacity,UErrorCode *status)

{
  int32_t iVar1;
  RegexMatcher m;
  RegexMatcher RStack_178;
  
  iVar1 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    RegexMatcher::RegexMatcher(&RStack_178,this);
    iVar1 = 0;
    if (RStack_178.fDeferredStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar1 = RegexMatcher::split(&RStack_178,input,dest,destCapacity,status);
    }
    RegexMatcher::~RegexMatcher(&RStack_178);
  }
  return iVar1;
}

Assistant:

int32_t  RegexPattern::split(UText *input,
        UText           *dest[],
        int32_t          destCapacity,
        UErrorCode      &status) const
{
    if (U_FAILURE(status)) {
        return 0;
    };

    RegexMatcher  m(this);
    int32_t r = 0;
    // Check m's status to make sure all is ok.
    if (U_SUCCESS(m.fDeferredStatus)) {
    	r = m.split(input, dest, destCapacity, status);
    }
    return r;
}